

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.hpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::remap_pixel_local_storage
          (CompilerGLSL *this,
          vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_> *inputs,
          vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_> *outputs)

{
  ::std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>::_M_move_assign
            (&this->pls_inputs);
  ::std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>::_M_move_assign
            (&this->pls_outputs,outputs);
  remap_pls_variables(this);
  return;
}

Assistant:

void remap_pixel_local_storage(std::vector<PlsRemap> inputs, std::vector<PlsRemap> outputs)
	{
		pls_inputs = std::move(inputs);
		pls_outputs = std::move(outputs);
		remap_pls_variables();
	}